

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_parser.cc
# Opt level: O0

bool aom_tools::anon_unknown_0::ParseObuExtensionHeader
               (uint8_t ext_header_byte,ObuHeader *obu_header)

{
  ObuHeader *obu_header_local;
  uint8_t ext_header_byte_local;
  
  obu_header->temporal_layer_id = (int)(uint)ext_header_byte >> 5;
  obu_header->spatial_layer_id = (int)(uint)ext_header_byte >> 3 & 3;
  return true;
}

Assistant:

bool ParseObuExtensionHeader(uint8_t ext_header_byte, ObuHeader *obu_header) {
  obu_header->temporal_layer_id =
      (ext_header_byte >> kObuExtTemporalIdBitsShift) &
      kObuExtTemporalIdBitsMask;
  obu_header->spatial_layer_id =
      (ext_header_byte >> kObuExtSpatialIdBitsShift) & kObuExtSpatialIdBitsMask;

  return true;
}